

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate.cpp
# Opt level: O0

void __thiscall
ktx::ValidationContext::error<unsigned_int&,unsigned_long,std::__cxx11::string,unsigned_long>
          (ValidationContext *this,IssueError *issue,uint *args,unsigned_long *args_1,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2,
          unsigned_long *args_3)

{
  format_args args_00;
  string_view fmt;
  basic_string_view<char,_std::char_traits<char>_> s;
  underlying_type_t<ktx::ReturnCode> uVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2_00;
  size_type in_RCX;
  size_type in_RDX;
  undefined1 *in_RSI;
  ValidationReport *in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  unsigned_long_long in_stack_00000098;
  ValidationReport *__args;
  string *psVar2;
  unsigned_long *args_3_00;
  allocator<char> *args_1_00;
  uint *in_stack_fffffffffffffe58;
  allocator<char> *in_stack_fffffffffffffe60;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffe68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe70;
  allocator<char> local_181;
  undefined1 local_180;
  undefined2 local_17e;
  unsigned_long local_178 [4];
  ValidationReport VStack_158;
  undefined1 local_108 [64];
  undefined8 local_c8;
  undefined1 *local_c0;
  undefined8 local_a8;
  string local_a0;
  ValidationReport *local_78;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 *local_60;
  undefined1 *local_58;
  undefined1 *local_50;
  undefined1 *local_38;
  undefined8 *local_30;
  undefined1 *local_28;
  undefined8 local_20;
  undefined8 *local_18;
  undefined1 *local_10;
  undefined8 *local_8;
  
  *(int *)&(in_RDI->details)._M_string_length = (int)(in_RDI->details)._M_string_length + 1;
  VStack_158.message.field_2._8_8_ = in_R9;
  VStack_158.details._0_8_ = in_R8;
  VStack_158.details._M_string_length = in_RCX;
  VStack_158.details.field_2._M_allocated_capacity = in_RDX;
  VStack_158.details.field_2._8_8_ = in_RSI;
  uVar1 = ktx::operator+(SUCCESS);
  *(underlying_type_t<ktx::ReturnCode> *)&(in_RDI->details).field_0x4 = uVar1;
  psVar2 = &in_RDI->message;
  local_180 = *(undefined1 *)VStack_158.details.field_2._8_8_;
  local_17e = *(undefined2 *)(VStack_158.details.field_2._8_8_ + 2);
  args_3_00 = local_178;
  args_2_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              (VStack_158.details.field_2._8_8_ + 8);
  args_1_00 = &local_181;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            (in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
  __args = &VStack_158;
  local_60 = (undefined8 *)(VStack_158.details.field_2._8_8_ + 0x18);
  local_58 = &stack0xfffffffffffffe58;
  local_70 = *local_60;
  local_68 = *(undefined8 *)(VStack_158.details.field_2._8_8_ + 0x20);
  s._M_str = (char *)args_3_00;
  s._M_len = (size_t)psVar2;
  ::fmt::v10::basic_string_view<char>::
  basic_string_view<std::basic_string_view<char,_std::char_traits<char>_>,_0>
            ((basic_string_view<char> *)in_RDI,s);
  local_8 = local_60;
  local_a0.field_2._M_allocated_capacity = VStack_158.details.field_2._M_allocated_capacity;
  local_a0._M_string_length = VStack_158.details._M_string_length;
  local_a0._M_dataplus = VStack_158.details._M_dataplus;
  local_a0._1_7_ = VStack_158.details._1_7_;
  local_a8 = VStack_158.message.field_2._8_8_;
  local_50 = (undefined1 *)((long)&local_a0.field_2 + 8);
  local_78 = __args;
  ::fmt::v10::
  make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,unsigned_int,unsigned_long,std::__cxx11::string,unsigned_long>
            (in_stack_fffffffffffffe58,(unsigned_long *)args_1_00,args_2_00,args_3_00);
  local_30 = &local_c8;
  local_38 = local_108;
  local_20 = 0x4d42;
  local_c8 = 0x4d42;
  fmt.size_ = (size_t)args_1;
  fmt.data_ = (char *)args_2;
  args_00.field_1.values_ =
       (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)args_3;
  args_00.desc_ = in_stack_00000098;
  local_28 = local_38;
  local_18 = local_30;
  local_10 = local_38;
  local_c0 = local_38;
  ::fmt::v10::vformat_abi_cxx11_(fmt,args_00);
  std::function<void_(const_ktx::ValidationReport_&)>::operator()
            ((function<void_(const_ktx::ValidationReport_&)> *)in_RDI,__args);
  ValidationReport::~ValidationReport(in_RDI);
  std::allocator<char>::~allocator(&local_181);
  return;
}

Assistant:

void error(const IssueError& issue, Args&&... args) {
        ++numError;
        returnCode = +rc::INVALID_FILE;
        callback(ValidationReport{issue.type, issue.id, std::string{issue.message}, fmt::format(issue.detailsFmt, std::forward<Args>(args)...)});
    }